

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O3

void __thiscall NaPNTrainDataGath::action(NaPNTrainDataGath *this)

{
  NaPetriCnInput *this_00;
  NaPetriCnInput *this_01;
  iterator iVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  NaVector *pNVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NaVector *pNVar16;
  undefined4 extraout_var_02;
  ulong uVar17;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar18;
  long lVar19;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char *pcVar20;
  NaPetriNet *pNVar21;
  NaTimer *pNVar22;
  ulong uVar23;
  bool bVar24;
  int iVar25;
  uint in_R11D;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (this->bTurnedOn == true) {
    this_00 = &this->in1;
    pNVar15 = NaPetriCnInput::data(this_00);
    iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
    iVar1._M_current =
         this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->par[0].vSeries,iVar1,
                 (double *)CONCAT44(extraout_var,iVar10));
    }
    else {
      *iVar1._M_current = *(double *)CONCAT44(extraout_var,iVar10);
      this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    this_01 = &this->in2;
    pNVar15 = NaPetriCnInput::data(this_01);
    iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
    iVar1._M_current =
         this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->par[1].vSeries,iVar1,
                 (double *)CONCAT44(extraout_var_01,iVar10));
    }
    else {
      *iVar1._M_current = *(double *)CONCAT44(extraout_var_01,iVar10);
      this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pNVar15 = NaPetriCnInput::data(this_00);
    pNVar16 = NaPetriCnOutput::data(&this->out1);
    (*pNVar16->_vptr_NaVector[2])(pNVar16,pNVar15);
    pNVar15 = NaPetriCnInput::data(this_01);
    pNVar16 = NaPetriCnOutput::data(&this->out2);
    (*pNVar16->_vptr_NaVector[2])(pNVar16,pNVar15);
    pNVar15 = NaPetriCnOutput::data(&this->turnoff);
    iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
    *(undefined8 *)CONCAT44(extraout_var_02,iVar10) = 0;
    NaPetriCnOutput::commit_data(&this->out1);
    NaPetriCnOutput::commit_data(&this->out2);
    uVar17 = (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar23 = (ulong)this->nStDetLen;
    if (uVar17 < uVar23) {
      pNVar15 = NaPetriCnInput::data(this_00);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      this->par[0].fSum = *(double *)CONCAT44(extraout_var_03,iVar10) + this->par[0].fSum;
      pNVar15 = NaPetriCnInput::data(this_00);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      dVar27 = *(double *)CONCAT44(extraout_var_04,iVar10);
      pNVar15 = NaPetriCnInput::data(this_00);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      this->par[0].fSum2 = dVar27 * *(double *)CONCAT44(extraout_var_05,iVar10) + this->par[0].fSum2
      ;
      pNVar15 = NaPetriCnInput::data(this_01);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      this->par[1].fSum = *(double *)CONCAT44(extraout_var_06,iVar10) + this->par[1].fSum;
      pNVar15 = NaPetriCnInput::data(this_01);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      dVar27 = *(double *)CONCAT44(extraout_var_07,iVar10);
      pNVar15 = NaPetriCnInput::data(this_01);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      this->par[1].fSum2 = dVar27 * *(double *)CONCAT44(extraout_var_08,iVar10) + this->par[1].fSum2
      ;
    }
    else if (uVar17 == uVar23) {
      pcVar20 = NaPetriNode::name(&this->super_NaPetriNode);
      pNVar21 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar22 = NaPetriNet::timer(pNVar21);
      uVar11 = (*pNVar22->_vptr_NaTimer[5])(pNVar22);
      lVar26 = 0;
      NaPrintLog("\'%s\' calculated statistics (at %d):\n",pcVar20,(ulong)uVar11);
      bVar9 = true;
      do {
        bVar24 = bVar9;
        lVar18 = (long)this->par[lVar26].vSeries.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)this->par[lVar26].vSeries.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = lVar18 >> 3;
        auVar28._8_4_ = (int)(lVar18 >> 0x23);
        auVar28._0_8_ = lVar19;
        auVar28._12_4_ = 0x45300000;
        dVar7 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
        dVar27 = this->par[lVar26].fSum2;
        dVar29 = this->par[lVar26].fSum / dVar7;
        this->par[lVar26].fAvg = dVar29;
        dVar27 = dVar27 / dVar7 - dVar29 * dVar29;
        if (dVar27 < 0.0) {
          dVar27 = sqrt(dVar27);
        }
        else {
          dVar27 = SQRT(dVar27);
        }
        this->par[lVar26].fSigma = dVar27;
        dVar7 = this->par[lVar26].fAvg;
        dVar29 = this->par[lVar26].fNSigma;
        this->par[lVar26].fRange[0] = dVar7 + dVar27 * -dVar29;
        this->par[lVar26].fRange[1] = dVar7 + dVar27 * dVar29;
        NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n");
        lVar26 = 1;
        bVar9 = false;
      } while (bVar24);
      pdVar2 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar26 = (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
      if (lVar26 != 0) {
        lVar26 = lVar26 >> 3;
        pdVar3 = this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar29 = this->par[1].fRange[0];
        dVar8 = this->par[1].fRange[1];
        dVar27 = this->par[0].fRange[0];
        dVar7 = this->par[0].fRange[1] - dVar27;
        piVar4 = this->mxHits;
        lVar18 = 0;
        do {
          iVar12 = this->par[0].nCells;
          iVar13 = this->par[1].nCells;
          auVar31._0_8_ = (pdVar3[lVar18] - dVar29) * (double)iVar13;
          auVar31._8_8_ = (pdVar2[lVar18] - dVar27) * (double)iVar12;
          auVar5._8_4_ = SUB84(dVar7,0);
          auVar5._0_8_ = dVar8 - dVar29;
          auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
          auVar32 = divpd(auVar31,auVar5);
          iVar10 = (int)auVar32._0_8_;
          iVar30 = (int)auVar32._8_8_;
          iVar25 = iVar30;
          if (iVar12 <= iVar30) {
            iVar25 = iVar12 + -1;
          }
          auVar33._4_4_ = iVar10;
          auVar33._0_4_ = iVar10;
          auVar33._8_4_ = iVar30;
          auVar33._12_4_ = iVar30;
          in_R11D = movmskpd(in_R11D,auVar33);
          iVar12 = 0;
          if ((in_R11D & 2) == 0) {
            iVar12 = iVar25;
          }
          if (iVar13 <= iVar10) {
            iVar10 = iVar13 + -1;
          }
          iVar25 = 0;
          if ((in_R11D & 1) == 0) {
            iVar25 = iVar10;
          }
          iVar25 = iVar12 * iVar13 + iVar25;
          iVar10 = piVar4[iVar25];
          if (iVar10 == 0) {
            this->nNonZeroHits = this->nNonZeroHits + 1;
            iVar10 = piVar4[iVar25];
          }
          piVar4[iVar25] = iVar10 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar26 + (ulong)(lVar26 == 0) != lVar18);
      }
      pcVar20 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar10 = this->par[1].nCells;
      uVar11 = this->nNonZeroHits;
      iVar12 = this->par[0].nCells;
      pNVar21 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar22 = NaPetriNet::timer(pNVar21);
      uVar14 = (*pNVar22->_vptr_NaTimer[5])(pNVar22);
      NaPrintLog("\'%s\' has %d non-zero cells (%4.1f%%) (at %d)\n",
                 ((double)(int)uVar11 * 100.0) / (double)(iVar10 * iVar12),pcVar20,(ulong)uVar11,
                 (ulong)uVar14);
    }
    else if (uVar23 < uVar17) {
      pNVar15 = NaPetriCnInput::data(this_00);
      iVar12 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      iVar10 = this->par[0].nCells;
      dVar27 = *(double *)CONCAT44(extraout_var_09,iVar12);
      dVar7 = this->par[0].fRange[0];
      dVar29 = this->par[0].fRange[1];
      pNVar15 = NaPetriCnInput::data(this_01);
      iVar13 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      iVar12 = this->par[1].nCells;
      dVar8 = this->par[1].fRange[0];
      auVar34._0_8_ = (*(double *)CONCAT44(extraout_var_10,iVar13) - dVar8) * (double)iVar12;
      auVar34._8_8_ = (dVar27 - dVar7) * (double)iVar10;
      dVar29 = dVar29 - dVar7;
      auVar32._8_4_ = SUB84(dVar29,0);
      auVar32._0_8_ = this->par[1].fRange[1] - dVar8;
      auVar32._12_4_ = (int)((ulong)dVar29 >> 0x20);
      auVar32 = divpd(auVar34,auVar32);
      iVar25 = (int)auVar32._0_8_;
      iVar30 = (int)auVar32._8_8_;
      iVar13 = iVar10 + -1;
      if (iVar30 < iVar10) {
        iVar13 = iVar30;
      }
      auVar6._4_4_ = iVar25;
      auVar6._0_4_ = iVar25;
      auVar6._8_4_ = iVar30;
      auVar6._12_4_ = iVar30;
      uVar11 = movmskpd(iVar30,auVar6);
      if ((uVar11 & 2) != 0) {
        iVar13 = 0;
      }
      iVar10 = iVar12 + -1;
      if (iVar25 < iVar12) {
        iVar10 = iVar25;
      }
      if ((uVar11 & 1) != 0) {
        iVar10 = 0;
      }
      iVar10 = iVar13 * iVar12 + iVar10;
      piVar4 = this->mxHits;
      iVar12 = piVar4[iVar10];
      if (iVar12 == 0) {
        this->nNonZeroHits = this->nNonZeroHits + 1;
        iVar12 = piVar4[iVar10];
      }
      piVar4[iVar10] = iVar12 + 1;
    }
    if (this->fMinHits <=
        ((double)this->nNonZeroHits * 100.0) / (double)(this->par[1].nCells * this->par[0].nCells))
    {
      pNVar15 = NaPetriCnOutput::data(&this->turnoff);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      *(undefined8 *)CONCAT44(extraout_var_11,iVar10) = 0x3ff0000000000000;
      this->bTurnedOn = false;
      pcVar20 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar10 = this->par[1].nCells;
      uVar11 = this->nNonZeroHits;
      iVar12 = this->par[0].nCells;
      pNVar21 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar22 = NaPetriNet::timer(pNVar21);
      uVar14 = (*pNVar22->_vptr_NaTimer[5])(pNVar22);
      NaPrintLog("\'%s\' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
                 ((double)(int)uVar11 * 100.0) / (double)(iVar10 * iVar12),pcVar20,(ulong)uVar11,
                 (ulong)uVar14);
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])(this);
      return;
    }
  }
  else {
    iVar10 = NaPetriConnector::links(&(this->turnon).super_NaPetriConnector);
    if (0 < iVar10) {
      pNVar15 = NaPetriCnInput::data(&this->turnon);
      iVar10 = (*pNVar15->_vptr_NaVector[8])(pNVar15,0);
      if ((*(double *)CONCAT44(extraout_var_00,iVar10) != 0.0) ||
         (NAN(*(double *)CONCAT44(extraout_var_00,iVar10)))) {
        this->bTurnedOn = true;
        pcVar20 = NaPetriNode::name(&this->super_NaPetriNode);
        pNVar21 = NaPetriNode::net(&this->super_NaPetriNode);
        pNVar22 = NaPetriNet::timer(pNVar21);
        uVar11 = (*pNVar22->_vptr_NaTimer[5])(pNVar22);
        NaPrintLog("\'%s\' is ON (at %d)\n",pcVar20,(ulong)uVar11);
        if (0 < this->par[1].nCells * this->par[0].nCells) {
          piVar4 = this->mxHits;
          lVar26 = 0;
          do {
            piVar4[lVar26] = 0;
            lVar26 = lVar26 + 1;
          } while (lVar26 < (long)this->par[1].nCells * (long)this->par[0].nCells);
        }
        this->nNonZeroHits = 0;
        this->par[0].fSum = 0.0;
        this->par[0].fSum2 = 0.0;
        this->par[1].fSum = 0.0;
        this->par[1].fSum2 = 0.0;
        pdVar2 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar2) {
          this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar2;
        }
        pdVar2 = this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar2) {
          this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void
NaPNTrainDataGath::action ()
{
  if(bTurnedOn)
    {
      par[0].vSeries.push_back(in1.data()[0]);
      par[1].vSeries.push_back(in2.data()[0]);
      /*
      NaPrintLog("'%s' gathered data at %d\n",
		 name(), net()->timer().CurrentIndex());
      */
      // Pass data through the node
      out1.data() = in1.data();
      out2.data() = in2.data();
      turnoff.data()[0] = 0;

      out1.commit_data();
      out2.commit_data();

      if(par[0].vSeries.size() < nStDetLen)
	{
	  par[0].fSum += in1.data()[0];
	  par[0].fSum2 += in1.data()[0] * in1.data()[0];

	  par[1].fSum += in2.data()[0];
	  par[1].fSum2 += in2.data()[0] * in2.data()[0];
	}
      else if(par[0].vSeries.size() == nStDetLen)
	{
	  NaPrintLog("'%s' calculated statistics (at %d):\n",
		     name(), net()->timer().CurrentIndex());
	  for(int i = 0; i < 2; ++i)
	    {
	      par[i].fAvg = par[i].fSum / par[i].vSeries.size();
	      par[i].fSigma = sqrt(par[i].fSum2 / par[i].vSeries.size()
				   - par[i].fAvg * par[i].fAvg);
	      par[i].fRange[0] = par[i].fAvg - par[i].fNSigma * par[i].fSigma;
	      par[i].fRange[1] = par[i].fAvg + par[i].fNSigma * par[i].fSigma;
	      NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n",
			 par[i].fAvg, par[i].fSigma,
			 par[i].fRange[0], par[i].fRange[1]);
	    }

	  // make classification for previous inputs
	  for(int j = 0; j < par[0].vSeries.size(); ++j)
	    {
	      int	i1 = par[0].cellIndex(par[0].vSeries[j]);
	      int	i2 = par[1].cellIndex(par[1].vSeries[j]);
	      int	i = i1 * par[1].nCells + i2;
	      if(mxHits[i] == 0)
		++nNonZeroHits;
	      ++mxHits[i];
	    }
	  NaPrintLog("'%s' has %d non-zero cells (%4.1f%%) (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	}
      else if(par[0].vSeries.size() > nStDetLen)
	{
	  int	i1 = par[0].cellIndex(in1.data()[0]);
	  int	i2 = par[1].cellIndex(in2.data()[0]);
	  int	i = i1 * par[1].nCells + i2;
	  if(mxHits[i] == 0)
	    ++nNonZeroHits;
	  ++mxHits[i];
	}

      if(100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells) >= fMinHits)
	{
	  turnoff.data()[0] = 1;
	  bTurnedOn = false;

	  NaPrintLog("'%s' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	  halt();
	}
    }
  else if(turnon.links() > 0)
    if(0 != turnon.data()[0])
      {
	bTurnedOn = true;

	NaPrintLog("'%s' is ON (at %d)\n",
		   name(), net()->timer().CurrentIndex());

	for(int i = 0; i < par[0].nCells * par[1].nCells; ++i)
	  mxHits[i] = 0;
	nNonZeroHits = 0;

	par[0].fSum = par[1].fSum = 0.0;
	par[0].fSum2 = par[1].fSum2 = 0.0;

	par[0].vSeries.clear();
	par[1].vSeries.clear();
      }
}